

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O3

void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference
               (IfcPolygonalBoundedHalfSpace *hs,TempMesh *result,TempMesh *first_operand,
               ConversionData *conv)

{
  iterator __first;
  aiVector3t<double> *__args;
  pointer pcVar1;
  iterator iVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  TempMesh *pTVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  IfcSurface *pIVar9;
  long lVar10;
  IfcAxis2Placement3D *pIVar11;
  IfcDirection *in;
  IfcCartesianPoint *in_00;
  IfcBoundedCurve *curve;
  pointer *ppaVar12;
  vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *pvVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  double *pdVar17;
  uint *puVar18;
  double dVar19;
  ulong uVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  bool bVar23;
  aiMatrix4x4t<double> *paVar24;
  undefined8 *puVar25;
  TempMesh *pTVar26;
  pointer paVar27;
  pointer paVar28;
  ulong uVar29;
  ulong uVar30;
  IfcVector3 *pIVar31;
  byte bVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  IfcVector3 e1;
  aiVector3t<double> res_2;
  IfcVector3 ei;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> blackside;
  IfcVector3 polyNormal;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> whiteside;
  shared_ptr<Assimp::IFC::TempMesh> profile;
  IfcMatrix4 proj;
  IfcVector3 e0;
  IfcMatrix4 proj_inv;
  IfcVector3 p;
  IfcVector3 profileNormal;
  aiVector3t<double> res_3;
  IfcVector3 local_408;
  IfcVector3 local_3e8;
  IfcVector3 local_3c8;
  double local_3a8;
  undefined8 uStack_3a0;
  IfcVector3 *local_398;
  pointer paStack_390;
  pointer local_388 [2];
  double local_378;
  uint local_36c;
  tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> local_368;
  IfcVector3 *local_338;
  IfcVector3 *pIStack_330;
  TempMesh *local_320;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_318;
  TempMesh *local_2f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  double local_2e8;
  double dStack_2e0;
  uint *local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  IfcVector3 local_2b8;
  aiMatrix4x4t<double> local_298;
  undefined1 local_218 [16];
  double local_208;
  double dStack_200;
  double local_1f8;
  TempMesh *local_1f0;
  undefined1 local_1e8 [8];
  _Alloc_hider _Stack_1e0;
  double dStack_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1d0;
  double local_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double local_190;
  double dStack_188;
  double local_180;
  double dStack_178;
  double local_170;
  IfcVector3 local_168;
  IfcVector3 local_150;
  double local_138;
  ulong uStack_130;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  IfcVector3 *local_108;
  IfcVector3 *pIStack_100;
  double local_f8;
  double dStack_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_e0;
  uint *local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  aiVector3t<double> local_a8;
  double local_88;
  ulong uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  
  bVar32 = 0;
  local_320 = result;
  local_1f0 = first_operand;
  if (hs == (IfcPolygonalBoundedHalfSpace *)0x0) {
    __assert_fail("hs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0x187,
                  "void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace *, TempMesh &, const TempMesh &, ConversionData &)"
                 );
  }
  pIVar9 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcSurface>
                     (*(LazyObject **)
                       &(hs->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.
                        field_0x30);
  lVar10 = __dynamic_cast((_func_int *)
                          ((long)&(pIVar9->super_IfcGeometricRepresentationItem).
                                  super_IfcRepresentationItem.
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                  ._vptr_ObjectHelper +
                          (long)(pIVar9->super_IfcGeometricRepresentationItem).
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                          &Schema_2x3::IfcPlane::typeinfo,0xffffffffffffffff);
  if (lVar10 == 0) {
    LogFunctions<Assimp::IFCImporter>::LogError((char *)e1.x);
    return;
  }
  local_168.x = 0.0;
  local_168.y = 0.0;
  local_168.z = 0.0;
  local_2b8.x = 0.0;
  local_2b8.y = 0.0;
  local_2b8.z = 1.0;
  pIVar11 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                      (*(LazyObject **)(lVar10 + 0x40));
  if (pIVar11->field_0x50 == '\x01') {
    pIVar11 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                        (*(LazyObject **)(lVar10 + 0x40));
    if (pIVar11->field_0x50 == '\0') {
      __assert_fail("have",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/./code/Step/STEPFile.h"
                    ,0x240,
                    "const T &Assimp::STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>>::Get() const [T = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>]"
                   );
    }
    in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>
                   (*(LazyObject **)&(pIVar11->super_IfcPlacement).field_0x48);
    ConvertDirection(&local_2b8,in);
  }
  pIVar11 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                      (*(LazyObject **)(lVar10 + 0x40));
  in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                    (*(LazyObject **)
                      &(pIVar11->super_IfcPlacement).super_IfcGeometricRepresentationItem.field_0x30
                    );
  ConvertCartesianPoint(&local_168,in_00);
  local_1e8 = (undefined1  [8])&PTR__PrimitiveDataType_0089e228;
  pcVar1 = (hs->super_IfcHalfSpaceSolid).AgreementFlag._M_dataplus._M_p;
  _Stack_1e0._M_p = (pointer)&aStack_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_1e0,pcVar1,
             pcVar1 + (hs->super_IfcHalfSpaceSolid).AgreementFlag._M_string_length);
  local_1e8 = (undefined1  [8])&PTR__PrimitiveDataType_0089e1f0;
  bVar6 = IsTrue((BOOLEAN *)local_1e8);
  local_1e8 = (undefined1  [8])&PTR__PrimitiveDataType_0089e228;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_1e0._M_p != &aStack_1d0) {
    operator_delete(_Stack_1e0._M_p,aStack_1d0._M_allocated_capacity + 1);
  }
  pTVar26 = local_1f0;
  if (!bVar6) {
    local_2b8.z = (double)((ulong)local_2b8.z ^ (ulong)DAT_006605d0);
  }
  auVar37._8_8_ = local_2b8.y;
  auVar37._0_8_ = local_2b8.x;
  uVar8 = (uint)bVar6;
  auVar39._0_4_ = (int)(uVar8 << 0x1f) >> 0x1f;
  auVar39._4_4_ = (int)(uVar8 << 0x1f) >> 0x1f;
  auVar39._8_4_ = (int)(uVar8 << 0x1f) >> 0x1f;
  auVar39._12_4_ = (int)(uVar8 << 0x1f) >> 0x1f;
  auVar37 = ~auVar39 & (_DAT_006605d0 ^ auVar37) | auVar37 & auVar39;
  local_2b8.x = auVar37._0_8_;
  dVar33 = auVar37._8_8_;
  local_2b8.y = 1.0 / SQRT(local_2b8.z * local_2b8.z + local_2b8.x * local_2b8.x + dVar33 * dVar33);
  local_2b8.z = local_2b8.z * local_2b8.y;
  local_2b8.x = local_2b8.y * local_2b8.x;
  local_2b8.y = local_2b8.y * dVar33;
  local_2f8 = (TempMesh *)operator_new(0x30);
  (local_2f8->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2f8->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2f8->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_2f8->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2f8->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2f8->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
            (&local_2f0,local_2f8);
  curve = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcBoundedCurve>
                    ((hs->PolygonalBoundary).obj);
  bVar6 = ProcessCurve(&curve->super_IfcCurve,local_2f8,conv);
  if (bVar6) {
    pIVar31 = (local_2f8->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    TempMesh::ComputePolygonNormal
              (&local_150,pIVar31,
               ((long)(local_2f8->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pIVar31 >> 3) *
               -0x5555555555555555,true);
    local_1e8 = (undefined1  [8])0x3ff0000000000000;
    _Stack_1e0._M_p = (pointer)0x0;
    dStack_1d8 = 0.0;
    aStack_1d0._M_allocated_capacity = 0;
    aStack_1d0._8_8_ = 0.0;
    local_1c0 = 1.0;
    local_1b8 = 0.0;
    dStack_1b0 = 0.0;
    local_1a8 = 0.0;
    dStack_1a0 = 0.0;
    local_198 = 1.0;
    local_190 = 0.0;
    dStack_188 = 0.0;
    local_180 = 0.0;
    dStack_178 = 0.0;
    local_170 = 1.0;
    pIVar11 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                        (*(LazyObject **)&(hs->super_IfcHalfSpaceSolid).field_0x68);
    ConvertAxisPlacement((IfcMatrix4 *)local_1e8,pIVar11);
    pdVar17 = (double *)local_1e8;
    paVar24 = &local_298;
    for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
      paVar24->a1 = *pdVar17;
      pdVar17 = pdVar17 + (ulong)bVar32 * -2 + 1;
      paVar24 = (aiMatrix4x4t<double> *)((long)paVar24 + (ulong)bVar32 * -0x10 + 8);
    }
    aiMatrix4x4t<double>::Inverse(&local_298);
    pTVar5 = local_320;
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&local_320->mVerts,
               ((long)(pTVar26->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar26->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    local_e0 = &pTVar5->mVertcnt;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (local_e0,(long)(pTVar26->mVertcnt).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar26->mVertcnt).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2);
    puVar18 = (pTVar26->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_d8 = (pTVar26->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (puVar18 != local_d8) {
      local_36c = 0;
      do {
        local_318.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_318.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_318.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_388[0] = (pointer)0x0;
        local_398 = (IfcVector3 *)0x0;
        paStack_390 = (IfcVector3 *)0x0;
        dVar33 = (double)(ulong)*puVar18;
        if (dVar33 != 0.0) {
          pIVar31 = (local_1f0->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + local_36c;
          local_3a8 = dVar33;
          TempMesh::ComputePolygonNormal((IfcVector3 *)&local_368,pIVar31,(size_t)dVar33,true);
          dVar33 = (pIVar31->z - local_168.z) * local_2b8.z +
                   (pIVar31->x - local_168.x) * local_2b8.x +
                   (pIVar31->y - local_168.y) * local_2b8.y;
          bVar6 = -1e-06 < dVar33;
          local_2d8 = puVar18;
          if (ABS(local_368.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                  .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                  super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y * local_2b8.z +
                  (double)local_368.
                          super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                          super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                          super__Tuple_impl<2UL,_unsigned_long>.
                          super__Head_base<2UL,_unsigned_long,_false>._M_head_impl * local_2b8.x +
                  local_368.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                  .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                  super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x * local_2b8.y) <=
              0.9999) {
            local_3a8 = (double)-(long)local_3a8;
            lVar10 = 1;
            local_338 = pIVar31;
            do {
              local_208 = pIVar31->z;
              local_218._0_8_ = pIVar31->x;
              local_218._8_8_ = pIVar31->y;
              lVar15 = 0;
              if ((long)local_3a8 + lVar10 != 0) {
                lVar15 = lVar10;
              }
              local_408.z = local_338[lVar15].z;
              local_408.x = local_338[lVar15].x;
              local_408.y = local_338[lVar15].y;
              local_3c8.x = 0.0;
              local_3c8.y = 0.0;
              pvVar13 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_398;
              if (bVar6 != false) {
                pvVar13 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                          &local_318;
              }
              local_3c8.z = 0.0;
              iVar2._M_current = *(aiVector3t<double> **)(pvVar13 + 8);
              if (iVar2._M_current == *(aiVector3t<double> **)(pvVar13 + 0x10)) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>(pvVar13,iVar2,pIVar31);
              }
              else {
                (iVar2._M_current)->z = pIVar31->z;
                dVar33 = pIVar31->y;
                (iVar2._M_current)->x = pIVar31->x;
                (iVar2._M_current)->y = dVar33;
                *(long *)(pvVar13 + 8) = *(long *)(pvVar13 + 8) + 0x18;
              }
              bVar7 = IntersectSegmentPlane
                                (&local_168,&local_2b8,(IfcVector3 *)local_218,&local_408,bVar6,
                                 &local_3c8);
              if (bVar7) {
                iVar2._M_current = *(aiVector3t<double> **)(pvVar13 + 8);
                if ((*(aiVector3t<double> **)pvVar13 == iVar2._M_current) ||
                   (dVar33 = iVar2._M_current[-1].x - local_3c8.x,
                   dVar19 = iVar2._M_current[-1].y - local_3c8.y,
                   dVar34 = iVar2._M_current[-1].z - local_3c8.z,
                   1e-12 < dVar34 * dVar34 + dVar33 * dVar33 + dVar19 * dVar19)) {
                  if (iVar2._M_current == *(aiVector3t<double> **)(pvVar13 + 0x10)) {
                    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                    _M_realloc_insert<aiVector3t<double>const&>(pvVar13,iVar2,&local_3c8);
                  }
                  else {
                    (iVar2._M_current)->z = local_3c8.z;
                    (iVar2._M_current)->x = local_3c8.x;
                    (iVar2._M_current)->y = local_3c8.y;
                    *(long *)(pvVar13 + 8) = *(long *)(pvVar13 + 8) + 0x18;
                  }
                }
                pvVar13 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                          &local_318;
                if (bVar6 != false) {
                  pvVar13 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                            &local_398;
                }
                iVar2._M_current = *(aiVector3t<double> **)(pvVar13 + 8);
                ppaVar12 = &local_318.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if (bVar6 != false) {
                  ppaVar12 = local_388;
                }
                if (iVar2._M_current == *ppaVar12) {
                  pvVar13 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                            &local_318;
                  if (bVar6 != false) {
                    pvVar13 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                              &local_398;
                  }
                  std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                  _M_realloc_insert<aiVector3t<double>const&>(pvVar13,iVar2,&local_3c8);
                }
                else {
                  (iVar2._M_current)->z = local_3c8.z;
                  (iVar2._M_current)->x = local_3c8.x;
                  (iVar2._M_current)->y = local_3c8.y;
                  *(pointer *)(pvVar13 + 8) = *(pointer *)(pvVar13 + 8) + 1;
                }
                bVar6 = (bool)(bVar6 ^ 1);
              }
              lVar15 = (long)local_3a8 + lVar10;
              lVar10 = lVar10 + 1;
              pIVar31 = pIVar31 + 1;
            } while (lVar15 != 0);
          }
          else {
            pvVar13 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_398;
            if (-1e-06 < dVar33) {
              pvVar13 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_318;
            }
            ppaVar12 = &paStack_390;
            if (-1e-06 < dVar33) {
              ppaVar12 = &local_318.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            }
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_range_insert<aiVector3t<double>const*>(pvVar13,*ppaVar12);
          }
          WritePolygon(&local_318,local_320);
          FilterPolygon((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                        &local_398);
          puVar18 = local_2d8;
          if (local_398 != paStack_390) {
            local_408.x = 0.0;
            local_408.y = 0.0;
            local_408.z = 0.0;
            dVar33 = local_398->x;
            dVar19 = local_398->y;
            dVar34 = local_398->z;
            local_368.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
            super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
            super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
            _M_head_impl = (_Head_base<2UL,_unsigned_long,_false>)
                           (local_298.a4 +
                           dVar34 * local_298.a3 + dVar33 * local_298.a1 + local_298.a2 * dVar19);
            local_368.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
            super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
            super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x =
                 local_298.b4 +
                 dVar34 * local_298.b3 + dVar33 * local_298.b1 + local_298.b2 * dVar19;
            local_368.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
            super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
            super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                 dVar34 * local_298.c3 + dVar33 * local_298.c1 + dVar19 * local_298.c2 +
                 local_298.c4;
            bVar6 = PointInPoly((IfcVector3 *)&local_368,&local_2f8->mVerts);
            local_378 = (double)CONCAT71(local_378._1_7_,bVar6);
            local_3c8.x = 0.0;
            local_3c8.y = 0.0;
            local_3c8.z = 0.0;
            if ((long)paStack_390 - (long)local_398 != 0) {
              dVar19 = (double)(((long)paStack_390 - (long)local_398 >> 3) * -0x5555555555555555);
              dVar33 = 0.0;
              do {
                dVar34 = local_398[(long)dVar33].x;
                dVar36 = local_398[(long)dVar33].y;
                dVar40 = local_398[(long)dVar33].z;
                local_338 = (IfcVector3 *)
                            (dVar40 * local_298.a3 + dVar34 * local_298.a1 + dVar36 * local_298.a2 +
                            local_298.a4);
                pIStack_330 = (IfcVector3 *)
                              (dVar40 * local_298.b3 + dVar34 * local_298.b1 + dVar36 * local_298.b2
                              + local_298.b4);
                local_3a8 = dVar40 * local_298.c3 + dVar34 * local_298.c1 + dVar36 * local_298.c2 +
                            local_298.c4;
                uStack_3a0 = 0;
                dVar34 = (double)((long)dVar33 + 1);
                dVar36 = 0.0;
                if (dVar34 != dVar19) {
                  dVar36 = dVar34;
                }
                dVar19 = local_398[(long)dVar36].x;
                dVar40 = local_398[(long)dVar36].y;
                dVar36 = local_398[(long)dVar36].z;
                local_3e8.x = dVar36 * local_298.a3 + dVar19 * local_298.a1 + dVar40 * local_298.a2
                              + local_298.a4;
                local_3e8.y = dVar36 * local_298.b3 + dVar19 * local_298.b1 + dVar40 * local_298.b2
                              + local_298.b4;
                local_3e8.z = local_298.c1 * dVar19 + local_298.c2 * dVar40 + local_298.c3 * dVar36
                              + local_298.c4;
                if (local_3c8.y != local_3c8.x) {
                  local_3c8.y = local_3c8.x;
                }
                local_218._0_8_ = local_338;
                local_218._8_8_ = pIStack_330;
                local_208 = local_3a8;
                IntersectsBoundaryProfile
                          ((IfcVector3 *)local_218,&local_3e8,&local_2f8->mVerts,bVar6,
                           (vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                            *)&local_3c8,false);
                uVar20 = (long)local_3c8.y - (long)local_3c8.x;
                if (0x20 < uVar20) {
                  uVar16 = 0;
                  bVar7 = false;
LAB_00538d3b:
                  uVar20 = (long)local_3c8.y - (long)local_3c8.x;
                  do {
                    bVar23 = bVar7;
                    puVar21 = (undefined8 *)((long)local_3c8.x + uVar16 * 0x20);
                    while (puVar25 = puVar21, uVar16 < ((long)uVar20 >> 5) - 1U) {
                      puVar21 = puVar25 + 4;
                      uVar16 = uVar16 + 1;
                      if (((double)puVar25[7] - local_3a8) * ((double)puVar25[7] - local_3a8) +
                          ((double)puVar25[5] - (double)local_338) *
                          ((double)puVar25[5] - (double)local_338) +
                          ((double)puVar25[6] - (double)pIStack_330) *
                          ((double)puVar25[6] - (double)pIStack_330) <
                          ((double)puVar25[3] - local_3a8) * ((double)puVar25[3] - local_3a8) +
                          ((double)puVar25[1] - (double)local_338) *
                          ((double)puVar25[1] - (double)local_338) +
                          ((double)puVar25[2] - (double)pIStack_330) *
                          ((double)puVar25[2] - (double)pIStack_330)) {
                        uVar3 = *puVar21;
                        *puVar21 = *puVar25;
                        *puVar25 = uVar3;
                        local_368.
                        super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                        super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                        super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                             (double)puVar25[7];
                        local_368.
                        super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                        super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                        super__Tuple_impl<2UL,_unsigned_long>.
                        super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_long,_false>)puVar25[5];
                        local_368.
                        super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                        super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                        super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x =
                             (double)puVar25[6];
                        puVar25[7] = puVar25[3];
                        puVar25[5] = puVar25[1];
                        puVar25[6] = puVar25[2];
                        puVar25[3] = local_368.
                                     super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                     .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                                     super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y
                        ;
                        puVar25[1] = local_368.
                                     super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                     .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                                     super__Tuple_impl<2UL,_unsigned_long>.
                                     super__Head_base<2UL,_unsigned_long,_false>._M_head_impl;
                        puVar25[2] = local_368.
                                     super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                     .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                                     super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x
                        ;
                        bVar7 = true;
                        goto LAB_00538d3b;
                      }
                    }
                    uVar16 = 0;
                    bVar7 = false;
                  } while (bVar23);
                }
                if (uVar20 == 0) {
                  bVar32 = 0;
                  dVar33 = dVar34;
                }
                else {
                  lVar10 = 0x18;
                  uVar20 = 0;
                  local_3a8 = dVar34;
                  do {
                    dVar19 = *(double *)((long)local_3c8.x + lVar10 + -0x10);
                    dVar34 = *(double *)((long)local_3c8.x + lVar10 + -8);
                    dVar36 = *(double *)((long)local_3c8.x + lVar10);
                    local_368.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z =
                         local_198 * dVar36 + local_1a8 * dVar19 + dStack_1a0 * dVar34 + local_190;
                    local_368.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<2UL,_unsigned_long>.
                    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
                         *(_Head_base<2UL,_unsigned_long,_false> *)
                          ((long)local_3c8.x + lVar10 + -0x18);
                    local_368.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x =
                         (double)aStack_1d0._M_allocated_capacity +
                         dVar36 * dStack_1d8 +
                         dVar19 * (double)local_1e8 + (double)_Stack_1e0._M_p * dVar34;
                    local_368.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                         dStack_1b0 +
                         dVar36 * local_1b8 + dVar19 * (double)aStack_1d0._8_8_ + local_1c0 * dVar34
                    ;
                    local_368.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = (unsigned_long)dVar33
                    ;
                    std::
                    vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>
                    ::emplace_back<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>
                              ((vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>
                                *)&local_408,&local_368);
                    uVar20 = uVar20 + 1;
                    lVar10 = lVar10 + 0x20;
                  } while (uVar20 < (ulong)((long)local_3c8.y - (long)local_3c8.x >> 5));
                  bVar32 = (byte)(((uint)((long)local_3c8.y - (long)local_3c8.x) & 0x20) >> 5);
                  dVar33 = local_3a8;
                }
                bVar6 = (bool)(bVar6 ^ bVar32);
                dVar19 = (double)(((long)paStack_390 - (long)local_398 >> 3) * -0x5555555555555555);
              } while ((ulong)dVar33 < (ulong)dVar19);
            }
            lVar10 = (long)local_408.y - (long)local_408.x;
            uVar20 = (lVar10 >> 3) * -0x3333333333333333;
            if ((uVar20 & 1) == 0) {
              puVar21 = (undefined8 *)local_408.x;
              puVar25 = (undefined8 *)local_408.y;
              if (1 < uVar20) {
                if (local_378._0_1_ == '\0') {
                  if (lVar10 == 0x28) {
                    lVar10 = 0x28;
                  }
                  else {
                    lVar15 = 0;
                    uVar16 = 0;
                    do {
                      uVar20 = ((uVar20 + uVar16) - 1) % uVar20;
                      uVar3 = *(undefined8 *)((long)local_408.x + lVar15 + 0x20);
                      *(undefined8 *)((long)local_408.x + lVar15 + 0x20) =
                           *(undefined8 *)((long)local_408.x + (uVar20 * 5 + 4) * 8);
                      *(undefined8 *)((long)local_408.x + (uVar20 * 5 + 4) * 8) = uVar3;
                      local_368.
                      super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                      super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                      super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                           *(double *)((long)local_408.x + lVar15 + 0x18);
                      pdVar17 = (double *)((long)local_408.x + lVar15 + 8);
                      local_368.
                      super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                      super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                      super__Tuple_impl<2UL,_unsigned_long>.
                      super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_long,_false>)*pdVar17;
                      local_368.
                      super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                      super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                      super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x = pdVar17[1];
                      *(undefined8 *)((long)local_408.x + lVar15 + 0x18) =
                           *(undefined8 *)((long)local_408.x + (uVar20 * 5 + 3) * 8);
                      uVar3 = *(undefined8 *)((long)local_408.x + (uVar20 * 5 + 2) * 8);
                      puVar22 = (undefined8 *)((long)local_408.x + lVar15 + 8);
                      *puVar22 = *(undefined8 *)((long)local_408.x + (uVar20 * 5 + 1) * 8);
                      puVar22[1] = uVar3;
                      *(double *)((long)local_408.x + (uVar20 * 5 + 3) * 8) =
                           local_368.
                           super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                           super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                           super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y;
                      *(_Head_base<2UL,_unsigned_long,_false> *)
                       ((long)local_408.x + (uVar20 * 5 + 1) * 8) =
                           local_368.
                           super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                           super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                           super__Tuple_impl<2UL,_unsigned_long>.
                           super__Head_base<2UL,_unsigned_long,_false>._M_head_impl;
                      *(double *)((long)local_408.x + (uVar20 * 5 + 2) * 8) =
                           local_368.
                           super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                           super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                           super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                      uVar3 = *(undefined8 *)((long)local_408.x + lVar15);
                      *(undefined8 *)((long)local_408.x + lVar15) =
                           *(undefined8 *)((long)local_408.x + uVar20 * 5 * 8);
                      *(undefined8 *)((long)local_408.x + uVar20 * 5 * 8) = uVar3;
                      uVar16 = uVar16 + 1;
                      lVar10 = (long)local_408.y - (long)local_408.x;
                      uVar20 = (lVar10 >> 3) * -0x3333333333333333;
                      lVar15 = lVar15 + 0x28;
                    } while (uVar16 < uVar20 - 1);
                  }
                }
                if (local_408.y != local_408.x) {
                  uVar20 = 0;
                  do {
                    uVar16 = (lVar10 >> 3) * -0x3333333333333333;
                    if (uVar16 - 1 <= uVar20) {
                      if ((1 < uVar16) &&
                         (((double)puVar25[-2] - (double)puVar21[3]) *
                          ((double)puVar25[-2] - (double)puVar21[3]) +
                          ((double)puVar25[-4] - (double)puVar21[1]) *
                          ((double)puVar25[-4] - (double)puVar21[1]) +
                          ((double)puVar25[-3] - (double)puVar21[2]) *
                          ((double)puVar25[-3] - (double)puVar21[2]) < 1e-10)) {
                        puVar22 = puVar21;
                        if ((puVar21 + 5 != puVar25 + -5) &&
                           (uVar20 = (long)(puVar25 + -5) - (long)(puVar21 + 5), 0 < (long)uVar20))
                        {
                          uVar20 = uVar20 / 0x28 + 1;
                          do {
                            puVar21[1] = puVar21[6];
                            puVar21[2] = puVar21[7];
                            puVar21[3] = puVar21[8];
                            puVar21[4] = puVar21[9];
                            *puVar21 = puVar21[5];
                            puVar21 = puVar21 + 5;
                            uVar20 = uVar20 - 1;
                            puVar22 = (undefined8 *)local_408.x;
                          } while (1 < uVar20);
                        }
                        local_408.y = (double)(puVar25 + -10);
                        puVar21 = puVar22;
                        puVar25 = (undefined8 *)local_408.y;
                      }
                      goto LAB_00538ff9;
                    }
                    uVar14 = uVar20 + 1;
                    uVar16 = uVar14 % uVar16;
                    if (((double)puVar21[uVar20 * 5 + 3] - (double)puVar21[uVar16 * 5 + 3]) *
                        ((double)puVar21[uVar20 * 5 + 3] - (double)puVar21[uVar16 * 5 + 3]) +
                        ((double)puVar21[uVar20 * 5 + 1] - (double)puVar21[uVar16 * 5 + 1]) *
                        ((double)puVar21[uVar20 * 5 + 1] - (double)puVar21[uVar16 * 5 + 1]) +
                        ((double)puVar21[uVar20 * 5 + 2] - (double)puVar21[uVar16 * 5 + 2]) *
                        ((double)puVar21[uVar20 * 5 + 2] - (double)puVar21[uVar16 * 5 + 2]) < 1e-10)
                    {
                      std::
                      vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                      ::_M_erase((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                  *)&local_408,
                                 (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                 (puVar21 + uVar20 * 5),
                                 (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                 (puVar21 + uVar20 * 5) + 2);
                      uVar14 = uVar20;
                      puVar21 = (undefined8 *)local_408.x;
                      puVar25 = (undefined8 *)local_408.y;
                    }
                    lVar10 = (long)puVar25 - (long)puVar21;
                    uVar20 = uVar14;
                  } while (lVar10 != 0);
                }
LAB_00539efa:
                pTVar26 = local_320;
                if (local_378._0_1_ == '\0') {
                  local_368.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                  .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                  super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
                  _M_head_impl._0_4_ =
                       (int)((ulong)((long)paStack_390 - (long)local_398) >> 3) * -0x55555555;
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>(local_e0,(uint *)&local_368);
                  std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                            ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                             pTVar26,(pTVar26->mVerts).
                                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,local_398,
                             paStack_390);
                }
                goto LAB_00539f52;
              }
LAB_00538ff9:
              if (puVar21 == puVar25) goto LAB_00539efa;
              local_2c8 = local_298.a1;
              local_2d0 = local_298.a2;
              local_118 = local_298.a3;
              uStack_110 = 0;
              local_378 = local_298.b1;
              local_2c0 = local_298.b2;
              local_128 = local_298.b3;
              uStack_120 = 0;
              local_3a8 = local_298.c1;
              local_338 = (IfcVector3 *)local_298.c2;
              local_138 = local_298.c3;
              uStack_130 = 0;
              TempMesh::ComputePolygonNormal
                        ((IfcVector3 *)&local_368,local_398,
                         ((long)paStack_390 - (long)local_398 >> 3) * -0x5555555555555555,true);
              if (local_408.x != local_408.y) {
                local_58._0_8_ =
                     local_118 *
                     local_368.
                     super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                     super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                     super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y +
                     local_2c8 *
                     (double)local_368.
                             super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                             .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                             super__Tuple_impl<2UL,_unsigned_long>.
                             super__Head_base<2UL,_unsigned_long,_false>._M_head_impl +
                     local_2d0 *
                     local_368.
                     super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                     super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                     super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                local_128 = local_128 *
                            local_368.
                            super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                            .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                            super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y +
                            local_378 *
                            (double)local_368.
                                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                    .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                                    super__Tuple_impl<2UL,_unsigned_long>.
                                    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl +
                            local_2c0 *
                            local_368.
                            super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                            .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                            super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                local_138 = local_138 *
                            local_368.
                            super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                            .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                            super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y +
                            local_3a8 *
                            (double)local_368.
                                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                    .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                                    super__Tuple_impl<2UL,_unsigned_long>.
                                    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl +
                            (double)local_338 *
                            local_368.
                            super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                            .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                            super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                local_c8 = local_150.z * local_138 +
                           local_150.x * (double)local_58._0_8_ + local_150.y * local_128;
                bVar6 = 0.0 <= local_c8;
                local_88 = ABS(local_138);
                uStack_80 = uStack_130 & 0x7fffffffffffffff;
                local_d0 = *(double *)(&DAT_006ac3b0 + (ulong)bVar6 * 8);
                local_58._8_8_ = local_58._0_8_;
                local_118 = (double)local_58._0_8_;
                local_78 = local_128;
                dStack_70 = local_128;
                local_68 = local_138;
                dStack_60 = local_138;
                do {
                  local_3e8.x = 0.0;
                  local_3e8.y = 0.0;
                  local_3e8.z = 0.0;
                  uVar20 = 0;
                  do {
                    uVar14 = ((long)local_408.y - (long)local_408.x >> 3) * -0x3333333333333333;
                    uVar16 = uVar20 + 1;
                    if (uVar14 < uVar16 || uVar14 - uVar16 == 0) {
                      __assert_fail("intersections.size() > currentIntersecIdx + 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                                    ,0x26a,
                                    "void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace *, TempMesh &, const TempMesh &, ConversionData &)"
                                   );
                    }
                    __first._M_current =
                         (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                         ((long)local_408.x + uVar20 * 5 * 8);
                    local_368.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
                         ((__first._M_current)->
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>).
                         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
                    local_368.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<2UL,_unsigned_long>.
                    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_long,_false>)
                         ((__first._M_current)->
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>).
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Tuple_impl<2UL,_unsigned_long>.
                         super__Head_base<2UL,_unsigned_long,_false>._M_head_impl;
                    local_368.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x =
                         ((__first._M_current)->
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>).
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                    local_368.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                         ((__first._M_current)->
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>).
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y;
                    local_368.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z =
                         ((__first._M_current)->
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>).
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z;
                    local_1f8 = *(double *)((long)local_408.x + (uVar16 * 5 + 4) * 8);
                    local_218._0_8_ = *(undefined8 *)((long)local_408.x + uVar16 * 5 * 8);
                    local_218._8_8_ = ((undefined8 *)((long)local_408.x + uVar16 * 5 * 8))[1];
                    local_208 = *(double *)((long)local_408.x + (uVar16 * 5 + 2) * 8);
                    dStack_200 = *(double *)((long)local_408.x + (uVar16 * 5 + 3) * 8);
                    std::
                    vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                    ::_M_erase((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                *)&local_408,__first,
                               (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                               ((long)local_408.x + (uVar20 + 2) * 5 * 8));
                    if (local_3e8.y == local_3e8.z) {
                      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                      _M_realloc_insert<aiVector3t<double>const&>
                                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                                 &local_3e8,(iterator)local_3e8.y,
                                 &local_368.
                                  super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                  .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                                  super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl);
                    }
                    else {
                      *(double *)((long)local_3e8.y + 0x10) =
                           local_368.
                           super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                           super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                           super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z;
                      *(double *)local_3e8.y =
                           local_368.
                           super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                           super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                           super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                      *(double *)((long)local_3e8.y + 8) =
                           local_368.
                           super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                           super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                           super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y;
                      local_3e8.y = (double)((long)local_3e8.y + 0x18);
                    }
                    if ((ulong)local_1f8 <
                        local_368.
                        super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl) {
                      lVar10 = ((long)paStack_390 - (long)local_398 >> 3) * -0x5555555555555555;
                    }
                    else {
                      lVar10 = 0;
                    }
                    uVar20 = ((long)local_1f8 -
                             local_368.
                             super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                             .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl) + lVar10;
                    if (uVar20 != 0) {
                      uVar16 = 1;
                      do {
                        __args = local_398 +
                                 (local_368.
                                  super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + uVar16
                                 ) % (ulong)(((long)paStack_390 - (long)local_398 >> 3) *
                                            -0x5555555555555555);
                        if (local_3e8.y == local_3e8.z) {
                          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                          _M_realloc_insert<aiVector3t<double>const&>
                                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>
                                      *)&local_3e8,(iterator)local_3e8.y,__args);
                        }
                        else {
                          *(double *)((long)local_3e8.y + 0x10) = __args->z;
                          dVar33 = __args->y;
                          *(double *)local_3e8.y = __args->x;
                          *(double *)((long)local_3e8.y + 8) = dVar33;
                          local_3e8.y = (double)((long)local_3e8.y + 0x18);
                        }
                        uVar16 = uVar16 + 1;
                      } while (uVar16 <= uVar20);
                    }
                    if (local_3e8.y == local_3e8.z) {
                      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                      _M_realloc_insert<aiVector3t<double>const&>
                                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                                 &local_3e8,(iterator)local_3e8.y,
                                 (aiVector3t<double> *)(local_218 + 8));
                    }
                    else {
                      *(double *)((long)local_3e8.y + 0x10) = dStack_200;
                      *(double *)local_3e8.y = (double)local_218._8_8_;
                      *(double *)((long)local_3e8.y + 8) = local_208;
                      local_3e8.y = (double)((long)local_3e8.y + 0x18);
                    }
                    local_2e8 = local_298.a4 +
                                dStack_200 * local_298.a3 +
                                (double)local_218._8_8_ * local_298.a1 + local_298.a2 * local_208;
                    dStack_2e0 = local_298.b4 +
                                 dStack_200 * local_298.b3 +
                                 (double)local_218._8_8_ * local_298.b1 + local_298.b2 * local_208;
                    local_338 = (IfcVector3 *)
                                (dStack_200 * local_298.c3 +
                                 (double)local_218._8_8_ * local_298.c1 + local_208 * local_298.c2 +
                                local_298.c4);
                    pIStack_330 = (IfcVector3 *)0x0;
                    paVar27 = (local_2f8->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    paVar28 = (local_2f8->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    uVar16 = ((long)(double *)local_218._0_8_ + (ulong)bVar6) %
                             (ulong)(((long)paVar28 - (long)paVar27 >> 3) * -0x5555555555555555);
                    uVar20 = 0xffffffffffffffff;
                    pTVar26 = local_2f8;
                    do {
                      if (uVar20 != 0xffffffffffffffff) goto LAB_00539cf9;
                      if (local_c8 < 0.0) {
                        uVar14 = uVar16 + 1;
                        uVar29 = ((long)paVar28 - (long)paVar27 >> 3) * -0x5555555555555555;
                      }
                      else {
                        uVar29 = ((long)paVar28 - (long)paVar27 >> 3) * -0x5555555555555555;
                        uVar14 = (uVar16 + uVar29) - 1;
                      }
                      uVar14 = uVar14 % uVar29;
                      local_f8 = paVar27[uVar14].x;
                      dStack_f0 = paVar27[uVar14].y;
                      if (local_88 <= 1e-05) {
                        dVar33 = paVar27[uVar16].z;
                        local_108 = (IfcVector3 *)paVar27[uVar14].z;
                      }
                      else {
                        auVar35._0_8_ = (paVar27[uVar16].x - local_2e8) * (double)local_58._0_8_;
                        auVar35._8_8_ = (local_f8 - local_2e8) * (double)local_58._8_8_;
                        auVar4._8_8_ = dStack_60;
                        auVar4._0_8_ = local_68;
                        auVar37 = divpd(auVar35,auVar4);
                        auVar38._0_8_ = (paVar27[uVar16].y - dStack_2e0) * local_78;
                        auVar38._8_8_ = (dStack_f0 - dStack_2e0) * dStack_70;
                        auVar39 = divpd(auVar38,auVar4);
                        dVar33 = auVar39._0_8_ + (double)local_338 + auVar37._0_8_;
                        local_108 = (IfcVector3 *)
                                    (auVar39._8_8_ + (double)local_338 + auVar37._8_8_);
                      }
                      dVar34 = local_f8 - paVar27[uVar16].x;
                      dVar36 = dStack_f0 - paVar27[uVar16].y;
                      dVar19 = dVar36 * local_150.z - local_150.y * ((double)local_108 - dVar33);
                      dVar40 = ((double)local_108 - dVar33) * local_150.x - local_150.z * dVar34;
                      dVar33 = dVar34 * local_150.y - dVar36 * local_150.x;
                      dVar36 = 1.0 / SQRT(dVar33 * dVar33 + dVar19 * dVar19 + dVar40 * dVar40);
                      dVar34 = dVar40 * dVar36 * local_138 - local_128 * dVar36 * dVar33;
                      dVar41 = dVar36 * dVar33 * local_118 - local_138 * dVar19 * dVar36;
                      dVar33 = dVar19 * dVar36 * local_128 - local_118 * dVar40 * dVar36;
                      dVar36 = 1.0 / SQRT(dVar33 * dVar33 + dVar34 * dVar34 + dVar41 * dVar41);
                      dVar19 = dVar34 * dVar36 * local_d0;
                      dVar34 = dVar41 * dVar36 * local_d0;
                      dVar33 = dVar36 * dVar33 * local_d0;
                      local_3a8 = 10000000000.0;
                      if ((1e-05 < local_88) &&
                         (local_3a8 = SQRT(((double)local_108 - (double)local_338) *
                                           ((double)local_108 - (double)local_338) +
                                           (local_f8 - local_2e8) * (local_f8 - local_2e8) +
                                           (dStack_f0 - dStack_2e0) * (dStack_f0 - dStack_2e0)),
                         10000000000.0 <= local_3a8)) {
                        local_3a8 = 10000000000.0;
                      }
                      dVar36 = *(double *)local_3e8.x;
                      dVar40 = *(double *)((long)local_3e8.x + 8);
                      local_2c0 = local_298.a2;
                      local_378 = local_298.a1;
                      dVar41 = *(double *)((long)local_3e8.x + 0x10);
                      local_2c8 = local_298.a3;
                      local_2d0 = local_298.a4;
                      local_b8 = local_298.b2;
                      local_b0 = local_298.b1;
                      local_c0 = local_298.b3;
                      dVar42 = (local_298.a3 * dVar41 +
                                local_298.a1 * dVar36 + local_298.a2 * dVar40 + local_298.a4) -
                               local_2e8;
                      dVar43 = (local_298.b3 * dVar41 +
                                local_298.b1 * dVar36 + dVar40 * local_298.b2 + local_298.b4) -
                               dStack_2e0;
                      dVar36 = (dVar41 * local_298.c3 +
                                dVar36 * local_298.c1 + dVar40 * local_298.c2 + local_298.c4) -
                               (double)local_338;
                      dVar40 = dVar36 * dVar33 + dVar42 * dVar19 + dVar34 * dVar43;
                      if ((dVar40 <= -1e-06) || (local_3a8 < dVar40)) {
                        uVar20 = 0xffffffffffffffff;
                      }
                      else {
                        dVar42 = dVar42 - dVar19 * dVar40;
                        dVar43 = dVar43 - dVar34 * dVar40;
                        dVar36 = dVar36 - dVar33 * dVar40;
                        uVar20 = 0xffffffffffffffff;
                        if (dVar36 * dVar36 + dVar42 * dVar42 + dVar43 * dVar43 < 1e-10) {
                          uVar20 = ((long)local_408.y - (long)local_408.x >> 3) *
                                   -0x3333333333333333;
                          local_3a8 = dVar40;
                        }
                      }
                      if ((long)local_408.y - (long)local_408.x != 0) {
                        pdVar17 = (double *)((long)local_408.x + 0x18);
                        uVar30 = 0;
                        do {
                          dVar36 = pdVar17[-2];
                          dVar40 = pdVar17[-1];
                          dVar41 = *pdVar17;
                          dVar42 = (local_298.a3 * dVar41 +
                                    local_298.a1 * dVar36 + local_298.a2 * dVar40 + local_298.a4) -
                                   local_2e8;
                          dVar43 = (local_298.b3 * dVar41 +
                                    local_298.b1 * dVar36 + local_298.b2 * dVar40 + local_298.b4) -
                                   dStack_2e0;
                          dVar36 = (dVar41 * local_298.c3 +
                                    dVar36 * local_298.c1 + dVar40 * local_298.c2 + local_298.c4) -
                                   (double)local_338;
                          dVar40 = dVar36 * dVar33 + dVar42 * dVar19 + dVar34 * dVar43;
                          if (((-1e-06 < dVar40) && (dVar40 <= local_3a8)) &&
                             (dVar42 = dVar42 - dVar19 * dVar40, dVar43 = dVar43 - dVar34 * dVar40,
                             dVar36 = dVar36 - dVar33 * dVar40,
                             dVar36 * dVar36 + dVar42 * dVar42 + dVar43 * dVar43 < 1e-10)) {
                            uVar20 = uVar30;
                            local_3a8 = dVar40;
                          }
                          uVar30 = uVar30 + 2;
                          pdVar17 = pdVar17 + 10;
                        } while (uVar30 < (ulong)(((long)local_408.y - (long)local_408.x >> 3) *
                                                 -0x3333333333333333));
                      }
                      pIStack_100 = local_108;
                      local_48 = dStack_f0;
                      dStack_40 = dStack_f0;
                      if (uVar20 == 0xffffffffffffffff) {
                        local_a8.x = (double)aStack_1d0._M_allocated_capacity +
                                     dStack_1d8 * (double)local_108 +
                                     local_f8 * (double)local_1e8 +
                                     (double)_Stack_1e0._M_p * dStack_f0;
                        local_a8.y = dStack_1b0 +
                                     local_1b8 * (double)local_108 +
                                     local_f8 * (double)aStack_1d0._8_8_ + local_1c0 * dStack_f0;
                        local_a8.z = local_198 * (double)local_108 +
                                     local_1a8 * local_f8 + dStack_1a0 * dStack_f0 + local_190;
                        if (local_3e8.y == local_3e8.z) {
                          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                          _M_realloc_insert<aiVector3t<double>>
                                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>
                                      *)&local_3e8,(iterator)local_3e8.y,&local_a8);
                          pTVar26 = local_2f8;
                        }
                        else {
                          *(double *)((long)local_3e8.y + 0x10) = local_a8.z;
                          *(double *)local_3e8.y = local_a8.x;
                          *(double *)((long)local_3e8.y + 8) = local_a8.y;
                          local_3e8.y = (double)((long)local_3e8.y + 0x18);
                        }
                        paVar27 = (pTVar26->mVerts).
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        paVar28 = (pTVar26->mVerts).
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                        uVar29 = ((long)paVar28 - (long)paVar27 >> 3) * -0x5555555555555555;
                        local_338 = local_108;
                        pIStack_330 = pIStack_100;
                        local_2e8 = local_f8;
                        dStack_2e0 = dStack_f0;
                        uVar16 = uVar14;
                      }
                      uVar14 = ((long)local_3e8.y - (long)local_3e8.x >> 3) * -0x5555555555555555;
                      uVar29 = ((long)paStack_390 - (long)local_398 >> 3) * -0x5555555555555555 +
                               uVar29;
                    } while (uVar14 < uVar29 || uVar14 - uVar29 == 0);
                    LogFunctions<Assimp::IFCImporter>::LogError((char *)0x539cf9);
LAB_00539cf9:
                  } while (uVar20 < (ulong)(((long)local_408.y - (long)local_408.x >> 3) *
                                           -0x3333333333333333));
                  WritePolygon((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               &local_3e8,local_320);
                  if ((double *)local_3e8.x != (double *)0x0) {
                    operator_delete((void *)local_3e8.x,(long)local_3e8.z - (long)local_3e8.x);
                  }
                } while (local_408.x != local_408.y);
              }
              if ((void *)local_3c8.x != (void *)0x0) {
                uVar20 = (long)local_3c8.z - (long)local_3c8.x;
                goto LAB_00539f64;
              }
            }
            else {
              LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x538fee);
LAB_00539f52:
              if ((void *)local_3c8.x != (void *)0x0) {
                uVar20 = (long)local_3c8.z - (long)local_3c8.x;
LAB_00539f64:
                operator_delete((void *)local_3c8.x,uVar20);
              }
            }
            puVar18 = local_2d8;
            if ((undefined8 *)local_408.x != (undefined8 *)0x0) {
              operator_delete((void *)local_408.x,(long)local_408.z - (long)local_408.x);
            }
          }
        }
        if (local_398 != (IfcVector3 *)0x0) {
          operator_delete(local_398,(long)local_388[0] - (long)local_398);
        }
        if (local_318.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_318.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_318.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_318.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_36c = local_36c + *puVar18;
        puVar18 = puVar18 + 1;
      } while (puVar18 != local_d8);
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x53a0d8);
  }
  else {
    LogFunctions<Assimp::IFCImporter>::LogError((char *)0x53a0ca);
  }
  if (local_2f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f0._M_pi);
  }
  return;
}

Assistant:

void ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace* hs, TempMesh& result,
                                                       const TempMesh& first_operand,
                                                       ConversionData& conv)
{
    ai_assert(hs != NULL);

    const Schema_2x3::IfcPlane* const plane = hs->BaseSurface->ToPtr<Schema_2x3::IfcPlane>();
    if(!plane) {
        IFCImporter::LogError("expected IfcPlane as base surface for the IfcHalfSpaceSolid");
        return;
    }

    // extract plane base position vector and normal vector
    IfcVector3 p,n(0.f,0.f,1.f);
    if (plane->Position->Axis) {
        ConvertDirection(n,plane->Position->Axis.Get());
    }
    ConvertCartesianPoint(p,plane->Position->Location);

    if(!IsTrue(hs->AgreementFlag)) {
        n *= -1.f;
    }

    n.Normalize();

    // obtain the polygonal bounding volume
    std::shared_ptr<TempMesh> profile = std::shared_ptr<TempMesh>(new TempMesh());
    if(!ProcessCurve(hs->PolygonalBoundary, *profile.get(), conv)) {
        IFCImporter::LogError("expected valid polyline for boundary of boolean halfspace");
        return;
    }

    // determine winding order by calculating the normal.
    IfcVector3 profileNormal = TempMesh::ComputePolygonNormal(profile->mVerts.data(), profile->mVerts.size());

    IfcMatrix4 proj_inv;
    ConvertAxisPlacement(proj_inv,hs->Position);

    // and map everything into a plane coordinate space so all intersection
    // tests can be done in 2D space.
    IfcMatrix4 proj = proj_inv;
    proj.Inverse();

    // clip the current contents of `meshout` against the plane we obtained from the second operand
    const std::vector<IfcVector3>& in = first_operand.mVerts;
    std::vector<IfcVector3>& outvert = result.mVerts;
    std::vector<unsigned int>& outvertcnt = result.mVertcnt;

    outvert.reserve(in.size());
    outvertcnt.reserve(first_operand.mVertcnt.size());

    unsigned int vidx = 0;
    std::vector<unsigned int>::const_iterator begin = first_operand.mVertcnt.begin();
    std::vector<unsigned int>::const_iterator end = first_operand.mVertcnt.end();
    std::vector<unsigned int>::const_iterator iit;
    for( iit = begin; iit != end; vidx += *iit++ )
    {
        // Our new approach: we cut the poly along the plane, then we intersect the part on the black side of the plane
        // against the bounding polygon. All the white parts, and the black part outside the boundary polygon, are kept.
        std::vector<IfcVector3> whiteside, blackside;

        {
            const IfcVector3* srcVertices = &in[vidx];
            const size_t srcVtxCount = *iit;
            if( srcVtxCount == 0 )
                continue;

            IfcVector3 polyNormal = TempMesh::ComputePolygonNormal(srcVertices, srcVtxCount, true);

            // if the poly is parallel to the plane, put it completely on the black or white side
            if( std::abs(polyNormal * n) > 0.9999 )
            {
                bool isOnWhiteSide = (srcVertices[0] - p) * n > -1e-6;
                std::vector<IfcVector3>& targetSide = isOnWhiteSide ? whiteside : blackside;
                targetSide.insert(targetSide.end(), srcVertices, srcVertices + srcVtxCount);
            }
            else
            {
                // otherwise start building one polygon for each side. Whenever the current line segment intersects the plane
                // we put a point there as an end of the current segment. Then we switch to the other side, put a point there, too,
                // as a beginning of the current segment, and simply continue accumulating vertices.
                bool isCurrentlyOnWhiteSide = ((srcVertices[0]) - p) * n > -1e-6;
                for( size_t a = 0; a < srcVtxCount; ++a )
                {
                    IfcVector3 e0 = srcVertices[a];
                    IfcVector3 e1 = srcVertices[(a + 1) % srcVtxCount];
                    IfcVector3 ei;

                    // put starting point to the current mesh
                    std::vector<IfcVector3>& trgt = isCurrentlyOnWhiteSide ? whiteside : blackside;
                    trgt.push_back(srcVertices[a]);

                    // if there's an intersection, put an end vertex there, switch to the other side's mesh,
                    // and add a starting vertex there, too
                    bool isPlaneHit = IntersectSegmentPlane(p, n, e0, e1, isCurrentlyOnWhiteSide, ei);
                    if( isPlaneHit )
                    {
                        if( trgt.empty() || (trgt.back() - ei).SquareLength() > 1e-12 )
                            trgt.push_back(ei);
                        isCurrentlyOnWhiteSide = !isCurrentlyOnWhiteSide;
                        std::vector<IfcVector3>& newtrgt = isCurrentlyOnWhiteSide ? whiteside : blackside;
                        newtrgt.push_back(ei);
                    }
                }
            }
        }

        // the part on the white side can be written into the target mesh right away
        WritePolygon(whiteside, result);

        // The black part is the piece we need to get rid of, but only the part of it within the boundary polygon.
        // So we now need to construct all the polygons that result from BlackSidePoly minus BoundaryPoly.
        FilterPolygon(blackside);

        // Complicated, II. We run along the polygon. a) When we're inside the boundary, we run on until we hit an
        // intersection, which means we're leaving it. We then start a new out poly there. b) When we're outside the
        // boundary, we start collecting vertices until we hit an intersection, then we run along the boundary until we hit
        // an intersection, then we switch back to the poly and run on on this one again, and so on until we got a closed
        // loop. Then we continue with the path we left to catch potential additional polys on the other side of the
        // boundary as described in a)
        if( !blackside.empty() )
        {
            // poly edge index, intersection point, edge index in boundary poly
            std::vector<std::tuple<size_t, IfcVector3, size_t> > intersections;
            bool startedInside = PointInPoly(proj * blackside.front(), profile->mVerts);
            bool isCurrentlyInside = startedInside;

            std::vector<std::pair<size_t, IfcVector3> > intersected_boundary;

            for( size_t a = 0; a < blackside.size(); ++a )
            {
                const IfcVector3 e0 = proj * blackside[a];
                const IfcVector3 e1 = proj * blackside[(a + 1) % blackside.size()];

                intersected_boundary.clear();
                IntersectsBoundaryProfile(e0, e1, profile->mVerts, isCurrentlyInside, intersected_boundary);
                // sort the hits by distance from e0 to get the correct in/out/in sequence. Manually :-( I miss you, C++11.
                if( intersected_boundary.size() > 1 )
                {
                    bool keepSorting = true;
                    while( keepSorting )
                    {
                        keepSorting = false;
                        for( size_t b = 0; b < intersected_boundary.size() - 1; ++b )
                        {
                            if( (intersected_boundary[b + 1].second - e0).SquareLength() < (intersected_boundary[b].second - e0).SquareLength() )
                            {
                                keepSorting = true;
                                std::swap(intersected_boundary[b + 1], intersected_boundary[b]);
                            }
                        }
                    }
                }
                // now add them to the list of intersections
                for( size_t b = 0; b < intersected_boundary.size(); ++b )
                    intersections.push_back(std::make_tuple(a, proj_inv * intersected_boundary[b].second, intersected_boundary[b].first));

                // and calculate our new inside/outside state
                if( intersected_boundary.size() & 1 )
                    isCurrentlyInside = !isCurrentlyInside;
            }

            // we got a list of in-out-combinations of intersections. That should be an even number of intersections, or
            // we're fucked.
            if( (intersections.size() & 1) != 0 )
            {
                IFCImporter::LogWarn("Odd number of intersections, can't work with that. Omitting half space boundary check.");
                continue;
            }

            if( intersections.size() > 1 )
            {
                // If we started outside, the first intersection is a out->in intersection. Cycle them so that it
                // starts with an intersection leaving the boundary
                if( !startedInside )
                for( size_t b = 0; b < intersections.size() - 1; ++b )
                    std::swap(intersections[b], intersections[(b + intersections.size() - 1) % intersections.size()]);

                // Filter pairs of out->in->out that lie too close to each other.
                for( size_t a = 0; intersections.size() > 0 && a < intersections.size() - 1; /**/ )
                {
                    if( (std::get<1>(intersections[a]) - std::get<1>(intersections[(a + 1) % intersections.size()])).SquareLength() < 1e-10 )
                        intersections.erase(intersections.begin() + a, intersections.begin() + a + 2);
                    else
                        a++;
                }
                if( intersections.size() > 1 && (std::get<1>(intersections.back()) - std::get<1>(intersections.front())).SquareLength() < 1e-10 )
                {
                    intersections.pop_back(); intersections.erase(intersections.begin());
                }
            }


            // no intersections at all: either completely inside the boundary, so everything gets discarded, or completely outside.
            // in the latter case we're implementional lost. I'm simply going to ignore this, so a large poly will not get any
            // holes if the boundary is smaller and does not touch it anywhere.
            if( intersections.empty() )
            {
                // starting point was outside -> everything is outside the boundary -> nothing is clipped -> add black side
                // to result mesh unchanged
                if( !startedInside )
                {
                    outvertcnt.push_back(static_cast<unsigned int>(blackside.size()));
                    outvert.insert(outvert.end(), blackside.begin(), blackside.end());
                    continue;
                }
                else
                {
                    // starting point was inside the boundary -> everything is inside the boundary -> nothing is spared from the
                    // clipping -> nothing left to add to the result mesh
                    continue;
                }
            }

            // determine the direction in which we're marching along the boundary polygon. If the src poly is faced upwards
            // and the boundary is also winded this way, we need to march *backwards* on the boundary.
            const IfcVector3 polyNormal = IfcMatrix3(proj) * TempMesh::ComputePolygonNormal(blackside.data(), blackside.size());
            bool marchBackwardsOnBoundary = (profileNormal * polyNormal) >= 0.0;

            // Build closed loops from these intersections. Starting from an intersection leaving the boundary we
            // walk along the polygon to the next intersection (which should be an IS entering the boundary poly).
            // From there we walk along the boundary until we hit another intersection leaving the boundary,
            // walk along the poly to the next IS and so on until we're back at the starting point.
            // We remove every intersection we "used up", so any remaining intersection is the start of a new loop.
            while( !intersections.empty() )
            {
                std::vector<IfcVector3> resultpoly;
                size_t currentIntersecIdx = 0;

                while( true )
                {
                    ai_assert(intersections.size() > currentIntersecIdx + 1);
                    std::tuple<size_t, IfcVector3, size_t> currintsec = intersections[currentIntersecIdx + 0];
                    std::tuple<size_t, IfcVector3, size_t> nextintsec = intersections[currentIntersecIdx + 1];
                    intersections.erase(intersections.begin() + currentIntersecIdx, intersections.begin() + currentIntersecIdx + 2);

                    // we start with an in->out intersection
                    resultpoly.push_back(std::get<1>(currintsec));
                    // climb along the polygon to the next intersection, which should be an out->in
                    size_t numPolyPoints = (std::get<0>(currintsec) > std::get<0>(nextintsec) ? blackside.size() : 0)
                        + std::get<0>(nextintsec) - std::get<0>(currintsec);
                    for( size_t a = 1; a <= numPolyPoints; ++a )
                        resultpoly.push_back(blackside[(std::get<0>(currintsec) + a) % blackside.size()]);
                    // put the out->in intersection
                    resultpoly.push_back(std::get<1>(nextintsec));

                    // generate segments along the boundary polygon that lie in the poly's plane until we hit another intersection
                    IfcVector3 startingPoint = proj * std::get<1>(nextintsec);
                    size_t currentBoundaryEdgeIdx = (std::get<2>(nextintsec) + (marchBackwardsOnBoundary ? 1 : 0)) % profile->mVerts.size();
                    size_t nextIntsecIdx = SIZE_MAX;
                    while( nextIntsecIdx == SIZE_MAX )
                    {
                        IfcFloat t = 1e10;

                        size_t nextBoundaryEdgeIdx = marchBackwardsOnBoundary ? (currentBoundaryEdgeIdx + profile->mVerts.size() - 1) : currentBoundaryEdgeIdx + 1;
                        nextBoundaryEdgeIdx %= profile->mVerts.size();
                        // vertices of the current boundary segments
                        IfcVector3 currBoundaryPoint = profile->mVerts[currentBoundaryEdgeIdx];
                        IfcVector3 nextBoundaryPoint = profile->mVerts[nextBoundaryEdgeIdx];
                        // project the two onto the polygon
                        if( std::abs(polyNormal.z) > 1e-5 )
                        {
                            currBoundaryPoint.z = startingPoint.z + (currBoundaryPoint.x - startingPoint.x) * polyNormal.x/polyNormal.z + (currBoundaryPoint.y - startingPoint.y) * polyNormal.y/polyNormal.z;
                            nextBoundaryPoint.z = startingPoint.z + (nextBoundaryPoint.x - startingPoint.x) * polyNormal.x/polyNormal.z + (nextBoundaryPoint.y - startingPoint.y) * polyNormal.y/polyNormal.z;
                        }

                        // build a direction that goes along the boundary border but lies in the poly plane
                        IfcVector3 boundaryPlaneNormal = ((nextBoundaryPoint - currBoundaryPoint) ^ profileNormal).Normalize();
                        IfcVector3 dirAtPolyPlane = (boundaryPlaneNormal ^ polyNormal).Normalize() * (marchBackwardsOnBoundary ? -1.0 : 1.0);
                        // if we can project the direction to the plane, we can calculate a maximum marching distance along that dir
                        // until we finish that boundary segment and continue on the next
                        if( std::abs(polyNormal.z) > 1e-5 )
                        {
                            t = std::min(t, (nextBoundaryPoint - startingPoint).Length());
                        }

                        // check if the direction hits the loop start - if yes, we got a poly to output
                        IfcVector3 dirToThatPoint = proj * resultpoly.front() - startingPoint;
                        IfcFloat tpt = dirToThatPoint * dirAtPolyPlane;
                        if( tpt > -1e-6 && tpt <= t && (dirToThatPoint - tpt * dirAtPolyPlane).SquareLength() < 1e-10 )
                        {
                            nextIntsecIdx = intersections.size(); // dirty hack to end marching along the boundary and signal the end of the loop
                            t = tpt;
                        }

                        // also check if the direction hits any in->out intersections earlier. If we hit one, we can switch back
                        // to marching along the poly border from that intersection point
                        for( size_t a = 0; a < intersections.size(); a += 2 )
                        {
                            dirToThatPoint = proj * std::get<1>(intersections[a]) - startingPoint;
                            tpt = dirToThatPoint * dirAtPolyPlane;
                            if( tpt > -1e-6 && tpt <= t && (dirToThatPoint - tpt * dirAtPolyPlane).SquareLength() < 1e-10 )
                            {
                                nextIntsecIdx = a; // switch back to poly and march on from this in->out intersection
                                t = tpt;
                            }
                        }

                        // if we keep marching on the boundary, put the segment end point to the result poly and well... keep marching
                        if( nextIntsecIdx == SIZE_MAX )
                        {
                            resultpoly.push_back(proj_inv * nextBoundaryPoint);
                            currentBoundaryEdgeIdx = nextBoundaryEdgeIdx;
                            startingPoint = nextBoundaryPoint;
                        }

                        // quick endless loop check
                        if( resultpoly.size() > blackside.size() + profile->mVerts.size() )
                        {
                            IFCImporter::LogError("Encountered endless loop while clipping polygon against poly-bounded half space.");
                            break;
                        }
                    }

                    // we're back on the poly - if this is the intersection we started from, we got a closed loop.
                    if( nextIntsecIdx >= intersections.size() )
                    {
                        break;
                    }

                    // otherwise it's another intersection. Continue marching from there.
                    currentIntersecIdx = nextIntsecIdx;
                }

                WritePolygon(resultpoly, result);
            }
        }
    }
    IFCImporter::LogDebug("generating CSG geometry by plane clipping with polygonal bounding (IfcBooleanClippingResult)");
}